

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void sycc_to_rgb(int offset,int upb,int y,int cb,int cr,int *out_r,int *out_g,int *out_b)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)((float)(cr - offset) * 1.402) + y;
  iVar1 = upb;
  if (iVar2 < upb) {
    iVar1 = iVar2;
  }
  if (iVar2 < 0) {
    iVar1 = 0;
  }
  *out_r = iVar1;
  iVar2 = y - (int)((float)(cb - offset) * 0.344 + (float)(cr - offset) * 0.714);
  iVar1 = upb;
  if (iVar2 < upb) {
    iVar1 = iVar2;
  }
  if (iVar2 < 0) {
    iVar1 = 0;
  }
  *out_g = iVar1;
  iVar1 = (int)((float)(cb - offset) * 1.772) + y;
  if (iVar1 < upb) {
    upb = iVar1;
  }
  if (iVar1 < 0) {
    upb = 0;
  }
  *out_b = upb;
  return;
}

Assistant:

static void sycc_to_rgb(int offset, int upb, int y, int cb, int cr,
                        int *out_r, int *out_g, int *out_b)
{
    int r, g, b;

    cb -= offset;
    cr -= offset;
    r = y + (int)(1.402 * (float)cr);
    if (r < 0) {
        r = 0;
    } else if (r > upb) {
        r = upb;
    }
    *out_r = r;

    g = y - (int)(0.344 * (float)cb + 0.714 * (float)cr);
    if (g < 0) {
        g = 0;
    } else if (g > upb) {
        g = upb;
    }
    *out_g = g;

    b = y + (int)(1.772 * (float)cb);
    if (b < 0) {
        b = 0;
    } else if (b > upb) {
        b = upb;
    }
    *out_b = b;
}